

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::DebugNodeWindow(ImGuiWindow *window,char *label)

{
  float fVar1;
  float fVar2;
  float fVar3;
  ImGuiWindow *pIVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  ImVec2 in_RAX;
  ImDrawList *this;
  char *pcVar8;
  uint uVar9;
  char *pcVar10;
  ulong uVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  long lVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  ImVec2 local_38;
  
  if (window != (ImGuiWindow *)0x0) {
    bVar7 = window->WasActive;
    pIVar4 = GImGui->NavWindow;
    local_38 = in_RAX;
    if (bVar7 == false) {
      PushStyleColor(0,(GImGui->Style).Colors + 1);
      pcVar12 = " *Inactive*";
    }
    else {
      pcVar12 = "";
    }
    bVar5 = TreeNodeEx(label,(uint)(pIVar4 == window),"%s \'%s\'%s",label,window->Name,pcVar12);
    if (bVar7 == false) {
      PopStyleColor(1);
    }
    bVar6 = IsItemHovered(0);
    if ((bVar6 & bVar7) == 1) {
      this = GetViewportDrawList(*(GImGui->Viewports).Data,1,"##Foreground");
      local_38.x = (window->Size).x + (window->Pos).x;
      local_38.y = (window->Size).y + (window->Pos).y;
      ImDrawList::AddRect(this,&window->Pos,&local_38,0xff00ffff,0.0,0,1.0);
    }
    if (bVar5) {
      if (window->MemoryCompacted == true) {
        TextDisabled("Note: some memory buffers have been compacted/freed.");
      }
      uVar9 = window->Flags;
      DebugNodeDrawList(window,window->DrawList,"DrawList");
      BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)",
                 (double)(window->Pos).x,(double)(window->Pos).y,(double)(window->Size).x,
                 (double)(window->Size).y,(double)(window->ContentSize).x,
                 (double)(window->ContentSize).y,(double)(window->ContentSizeIdeal).x,
                 (double)(window->ContentSizeIdeal).y);
      pcVar12 = "Child ";
      if ((uVar9 >> 0x18 & 1) == 0) {
        pcVar12 = "";
      }
      auVar22._0_4_ = -(uint)((uVar9 & 0x10000000) == 0);
      auVar22._4_4_ = -(uint)((uVar9 & 0x8000000) == 0);
      auVar22._8_4_ = -(uint)((uVar9 & 0x4000000) == 0);
      auVar22._12_4_ = -(uint)((uVar9 & 0x2000000) == 0);
      auVar21._0_4_ = -(uint)((uVar9 & 0x40) == 0);
      auVar21._4_4_ = -(uint)((uVar9 & 0x40000) == 0);
      auVar21._8_4_ = -(uint)((uVar9 & 0x200) == 0);
      auVar21._12_4_ = -(uint)((uVar9 & 0x100) == 0);
      auVar22 = packssdw(auVar21,auVar22);
      auVar22 = packsswb(auVar22,auVar22);
      pcVar8 = "Tooltip ";
      if ((auVar22 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar8 = "";
      }
      pcVar10 = "Popup ";
      if ((auVar22 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar10 = "";
      }
      pcVar13 = "Modal ";
      if ((auVar22 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar13 = "";
      }
      pcVar14 = "ChildMenu ";
      if ((auVar22 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar14 = "";
      }
      pcVar15 = "NoSavedSettings ";
      if ((auVar22 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar15 = "";
      }
      pcVar19 = "NoMouseInputs";
      if ((auVar22 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar19 = "";
      }
      pcVar16 = "NoNavInputs";
      if ((auVar22 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar16 = "";
      }
      pcVar18 = "AlwaysAutoResize";
      if ((auVar22 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        pcVar18 = "";
      }
      BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)",(ulong)uVar9,pcVar12,pcVar8,pcVar10,pcVar13,
                 pcVar14,pcVar15,pcVar19,pcVar16,pcVar18);
      pcVar12 = "##X";
      if (window->ScrollbarX == false) {
        pcVar12 = " \t";
      }
      pcVar8 = "##Y";
      if (window->ScrollbarY == false) {
        pcVar8 = " \t";
      }
      BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s",(double)(window->Scroll).x,
                 (double)(window->ScrollMax).x,(double)(window->Scroll).y,
                 (double)(window->ScrollMax).y,pcVar12 + 2,pcVar8 + 2);
      if ((window->Active != false) || (uVar11 = 0xffffffff, window->WasActive != false)) {
        uVar11 = (ulong)(uint)(int)window->BeginOrderWithinContext;
      }
      BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d",
                 (ulong)window->Active,(ulong)window->WasActive,(ulong)window->WriteAccessed,uVar11)
      ;
      BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d",
                 (ulong)window->Appearing,(ulong)window->Hidden,
                 (ulong)(uint)(int)window->HiddenFramesCanSkipItems,
                 (ulong)(uint)(int)window->HiddenFramesCannotSkipItems,(ulong)window->SkipItems);
      lVar17 = 0x380;
      uVar9 = 0;
      do {
        fVar1 = *(float *)((long)window + lVar17 * 4 + -0xa78);
        fVar2 = *(float *)((long)window + lVar17 * 4 + -0xa74);
        fVar3 = *(float *)((long)window + lVar17 * 4 + -0xa6c);
        if ((fVar1 < fVar3) || (fVar2 < fVar3)) {
          BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)",(double)fVar1,(double)fVar2
                     ,(double)*(float *)((long)window + lVar17 * 4 + -0xa70),(double)fVar3,
                     (ulong)uVar9,(ulong)*(uint *)((long)&window->Name + lVar17));
        }
        else {
          BulletText("NavLastIds[%d]: 0x%08X",(ulong)uVar9,
                     (ulong)*(uint *)((long)&window->Name + lVar17));
        }
        DebugLocateItemOnHover(*(ImGuiID *)((long)&window->Name + lVar17));
        lVar17 = lVar17 + 4;
        uVar9 = uVar9 + 1;
      } while (lVar17 == 900);
      if (window->NavLastChildNavWindow == (ImGuiWindow *)0x0) {
        pcVar12 = "NULL";
      }
      else {
        pcVar12 = window->NavLastChildNavWindow->Name;
      }
      BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s",
                 (ulong)(uint)(int)(window->DC).NavLayersActiveMask,pcVar12);
      if (window->RootWindow != window) {
        DebugNodeWindow(window->RootWindow,"RootWindow");
      }
      if (window->ParentWindow != (ImGuiWindow *)0x0) {
        DebugNodeWindow(window->ParentWindow,"ParentWindow");
      }
      if (0 < (window->DC).ChildWindows.Size) {
        DebugNodeWindowsList(&(window->DC).ChildWindows,"ChildWindows");
      }
      if (0 < (window->ColumnsStorage).Size) {
        bVar7 = TreeNode("Columns","Columns sets (%d)");
        if (bVar7) {
          if (0 < (window->ColumnsStorage).Size) {
            lVar17 = 0;
            lVar20 = 0;
            do {
              DebugNodeColumns((ImGuiOldColumns *)
                               ((long)&((window->ColumnsStorage).Data)->ID + lVar17));
              lVar20 = lVar20 + 1;
              lVar17 = lVar17 + 0x88;
            } while (lVar20 < (window->ColumnsStorage).Size);
          }
          TreePop();
        }
      }
      DebugNodeStorage(&window->StateStorage,"Storage");
      TreePop();
    }
    return;
  }
  BulletText("%s: NULL",label);
  return;
}

Assistant:

void ImGui::DebugNodeWindow(ImGuiWindow* window, const char* label)
{
    if (window == NULL)
    {
        BulletText("%s: NULL", label);
        return;
    }

    ImGuiContext& g = *GImGui;
    const bool is_active = window->WasActive;
    ImGuiTreeNodeFlags tree_node_flags = (window == g.NavWindow) ? ImGuiTreeNodeFlags_Selected : ImGuiTreeNodeFlags_None;
    if (!is_active) { PushStyleColor(ImGuiCol_Text, GetStyleColorVec4(ImGuiCol_TextDisabled)); }
    const bool open = TreeNodeEx(label, tree_node_flags, "%s '%s'%s", label, window->Name, is_active ? "" : " *Inactive*");
    if (!is_active) { PopStyleColor(); }
    if (IsItemHovered() && is_active)
        GetForegroundDrawList(window)->AddRect(window->Pos, window->Pos + window->Size, IM_COL32(255, 255, 0, 255));
    if (!open)
        return;

    if (window->MemoryCompacted)
        TextDisabled("Note: some memory buffers have been compacted/freed.");

    ImGuiWindowFlags flags = window->Flags;
    DebugNodeDrawList(window, window->DrawList, "DrawList");
    BulletText("Pos: (%.1f,%.1f), Size: (%.1f,%.1f), ContentSize (%.1f,%.1f) Ideal (%.1f,%.1f)", window->Pos.x, window->Pos.y, window->Size.x, window->Size.y, window->ContentSize.x, window->ContentSize.y, window->ContentSizeIdeal.x, window->ContentSizeIdeal.y);
    BulletText("Flags: 0x%08X (%s%s%s%s%s%s%s%s%s..)", flags,
        (flags & ImGuiWindowFlags_ChildWindow)  ? "Child " : "",      (flags & ImGuiWindowFlags_Tooltip)     ? "Tooltip "   : "",  (flags & ImGuiWindowFlags_Popup) ? "Popup " : "",
        (flags & ImGuiWindowFlags_Modal)        ? "Modal " : "",      (flags & ImGuiWindowFlags_ChildMenu)   ? "ChildMenu " : "",  (flags & ImGuiWindowFlags_NoSavedSettings) ? "NoSavedSettings " : "",
        (flags & ImGuiWindowFlags_NoMouseInputs)? "NoMouseInputs":"", (flags & ImGuiWindowFlags_NoNavInputs) ? "NoNavInputs" : "", (flags & ImGuiWindowFlags_AlwaysAutoResize) ? "AlwaysAutoResize" : "");
    BulletText("Scroll: (%.2f/%.2f,%.2f/%.2f) Scrollbar:%s%s", window->Scroll.x, window->ScrollMax.x, window->Scroll.y, window->ScrollMax.y, window->ScrollbarX ? "X" : "", window->ScrollbarY ? "Y" : "");
    BulletText("Active: %d/%d, WriteAccessed: %d, BeginOrderWithinContext: %d", window->Active, window->WasActive, window->WriteAccessed, (window->Active || window->WasActive) ? window->BeginOrderWithinContext : -1);
    BulletText("Appearing: %d, Hidden: %d (CanSkip %d Cannot %d), SkipItems: %d", window->Appearing, window->Hidden, window->HiddenFramesCanSkipItems, window->HiddenFramesCannotSkipItems, window->SkipItems);
    for (int layer = 0; layer < ImGuiNavLayer_COUNT; layer++)
    {
        ImRect r = window->NavRectRel[layer];
        if (r.Min.x >= r.Max.y && r.Min.y >= r.Max.y)
            BulletText("NavLastIds[%d]: 0x%08X", layer, window->NavLastIds[layer]);
        else
            BulletText("NavLastIds[%d]: 0x%08X at +(%.1f,%.1f)(%.1f,%.1f)", layer, window->NavLastIds[layer], r.Min.x, r.Min.y, r.Max.x, r.Max.y);
        DebugLocateItemOnHover(window->NavLastIds[layer]);
    }
    BulletText("NavLayersActiveMask: %X, NavLastChildNavWindow: %s", window->DC.NavLayersActiveMask, window->NavLastChildNavWindow ? window->NavLastChildNavWindow->Name : "NULL");
    if (window->RootWindow != window)       { DebugNodeWindow(window->RootWindow, "RootWindow"); }
    if (window->ParentWindow != NULL)       { DebugNodeWindow(window->ParentWindow, "ParentWindow"); }
    if (window->DC.ChildWindows.Size > 0)   { DebugNodeWindowsList(&window->DC.ChildWindows, "ChildWindows"); }
    if (window->ColumnsStorage.Size > 0 && TreeNode("Columns", "Columns sets (%d)", window->ColumnsStorage.Size))
    {
        for (int n = 0; n < window->ColumnsStorage.Size; n++)
            DebugNodeColumns(&window->ColumnsStorage[n]);
        TreePop();
    }
    DebugNodeStorage(&window->StateStorage, "Storage");
    TreePop();
}